

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::setNum(QByteArray *this,double n,char format,int precision)

{
  QArrayData *data;
  char *pcVar1;
  qsizetype qVar2;
  DoubleForm form;
  char cVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = format + ' ';
  if (0x19 < (int)CONCAT71(in_register_00000031,format) - 0x41U) {
    cVar3 = format;
  }
  form = DFSignificantDigits;
  if (cVar3 != 'g') {
    form = (uint)(cVar3 != 'e');
  }
  qdtoAscii(&local_38,n,form,precision,(byte)(format + 0xbfU) < 0x1a);
  data = &((this->d).d)->super_QArrayData;
  pcVar1 = (this->d).ptr;
  (this->d).d = local_38.d.d;
  (this->d).ptr = local_38.d.ptr;
  qVar2 = (this->d).size;
  (this->d).size = local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = pcVar1;
  local_38.d.size = qVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::setNum(double n, char format, int precision)
{
    return *this = QByteArray::number(n, format, precision);
}